

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::~MidiFile(MidiFile *this)

{
  MidiEventList *this_00;
  reference ppMVar1;
  MidiFile *this_local;
  
  std::__cxx11::string::clear();
  clear(this);
  ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,0);
  if (*ppMVar1 != (value_type)0x0) {
    ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,0);
    this_00 = *ppMVar1;
    if (this_00 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(this_00);
      operator_delete(this_00);
    }
    ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,0);
    *ppMVar1 = (value_type)0x0;
  }
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,0);
  this->m_rwstatus = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::clear(&this->m_timemap);
  this->m_timemapvalid = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::~vector(&this->m_timemap);
  std::__cxx11::string::~string((string *)&this->m_readFileName);
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::~vector(&this->m_events)
  ;
  return;
}

Assistant:

MidiFile::~MidiFile() {
	m_readFileName.clear();
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
		m_events[0] = NULL;
	}
	m_events.resize(0);
	m_rwstatus = false;
	m_timemap.clear();
	m_timemapvalid = 0;
}